

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O1

bool QTestPrivate::appendCharBuffer(QTestCharBuffer *accumulator,QTestCharBuffer *more)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t __n;
  
  uVar1 = more->_size;
  __n = 0;
  if ((0 < (long)(int)uVar1) && (pcVar3 = more->buf, pcVar3 != (char *)0x0)) {
    pvVar5 = memchr(pcVar3,0,(long)(int)uVar1);
    if (pvVar5 != (void *)0x0) {
      uVar1 = (int)pvVar5 - (int)pcVar3;
    }
    __n = (size_t)uVar1;
  }
  bVar6 = true;
  if (0 < (int)__n) {
    iVar2 = accumulator->_size;
    iVar8 = 0;
    if ((0 < (long)iVar2) && (pcVar3 = accumulator->buf, iVar8 = 0, pcVar3 != (char *)0x0)) {
      pvVar5 = memchr(pcVar3,0,(long)iVar2);
      iVar8 = iVar2;
      if (pvVar5 != (void *)0x0) {
        iVar8 = (int)pvVar5 - (int)pcVar3;
      }
    }
    iVar7 = iVar8 + (int)__n;
    if ((iVar7 < 0x200000) &&
       ((iVar7 < iVar2 || (bVar4 = QTestCharBuffer::reset(accumulator,iVar7 + 1,true), bVar4)))) {
      pcVar3 = accumulator->buf;
      memcpy(pcVar3 + iVar8,more->buf,__n);
      (pcVar3 + iVar8)[__n] = '\0';
    }
    else {
      bVar6 = false;
    }
    return bVar6;
  }
  return true;
}

Assistant:

bool appendCharBuffer(QTestCharBuffer *accumulator, const QTestCharBuffer &more)
{
    const auto bufsize = [](const QTestCharBuffer &buf) -> int {
        const int max = buf.size();
        return max > 0 ? int(qstrnlen(buf.constData(), max)) : 0;
    };
    const int extra = bufsize(more);
    if (extra <= 0)
        return true; // Nothing to do, fatuous success

    const int oldsize = bufsize(*accumulator);
    const int newsize = oldsize + extra + 1; // 1 for final '\0'
    if (newsize > MAXSIZE || !accumulator->resize(newsize))
        return false; // too big or unable to grow

    char *tail = accumulator->data() + oldsize;
    memcpy(tail, more.constData(), extra);
    tail[extra] = '\0';
    return true;
}